

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall kratos::FSM::add_child_fsm(FSM *this,FSM *fsm)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  UserException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  string local_48;
  FSM *local_28;
  FSM *fsm_local;
  
  local_28 = fsm;
  if (fsm->generator_ == this->generator_) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::FSM*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::FSM*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::FSM*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::FSM*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::FSM*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
                *)&this->child_fsms_,&fsm->fsm_name_,&local_28);
    local_28->parent_fsm_ = this;
    (local_28->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    this_00 = (local_28->start_state_).
              super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (local_28->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  this_01 = (UserException *)__cxa_allocate_exception(0x10);
  local_68 = (fsm->fsm_name_)._M_dataplus._M_p;
  sStack_60 = (fsm->fsm_name_)._M_string_length;
  local_58 = (this->fsm_name_)._M_dataplus._M_p;
  sStack_50 = (this->fsm_name_)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x35;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_48,(detail *)"FSM {0} doesn\'t have the same generator parent as {1}",format_str
             ,args);
  UserException::UserException(this_01,&local_48);
  __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FSM::add_child_fsm(FSM* fsm) {
    if (fsm->generator_ != generator_)
        throw UserException(::format("FSM {0} doesn't have the same generator parent as {1}",
                                     fsm->fsm_name_, fsm_name_));
    child_fsms_.emplace(fsm->fsm_name_, fsm);
    fsm->parent_fsm_ = this;
    // erase the start from the child generator
    fsm->start_state_ = nullptr;
}